

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O3

bool __thiscall particleSamples::decide_to_pick_OSCAR(particleSamples *this,int POI,int monval)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  
  if (POI < 0x270c) {
    if (POI == -0x270e) {
      iVar2 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
      bVar3 = (byte)((uint)iVar2 >> 0x18);
    }
    else if (POI == -0x270d) {
      iVar2 = particle_decay::get_particle_baryon_number(this->decayer_ptr,monval);
      bVar3 = (byte)((uint)iVar2 >> 0x18);
    }
    else {
      if (POI != -0x270c) goto LAB_0011ac95;
      iVar2 = particle_decay::get_particle_strange_number(this->decayer_ptr,monval);
      bVar3 = (byte)((uint)iVar2 >> 0x18);
    }
    bVar1 = (bool)(bVar3 >> 7);
  }
  else {
    switch(POI) {
    case 0x270c:
      iVar2 = particle_decay::get_particle_strange_number(this->decayer_ptr,monval);
      break;
    case 0x270d:
      iVar2 = particle_decay::get_particle_baryon_number(this->decayer_ptr,monval);
      break;
    case 0x270e:
      iVar2 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
      break;
    case 9999:
      iVar2 = particle_decay::get_particle_charge(this->decayer_ptr,monval);
      return iVar2 != 0;
    default:
      if (POI == 99999) {
        return true;
      }
LAB_0011ac95:
      return monval == POI;
    }
    bVar1 = 0 < iVar2;
  }
  return bVar1;
}

Assistant:

bool particleSamples::decide_to_pick_OSCAR(int POI, int monval) {
    bool pick_flag = false;
    if (POI == 99999) {
        // all particles
        pick_flag = true;
    } else if (POI == 9999) {
        // charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge != 0) {
            pick_flag = true;
        }
    } else if (POI == 9998) {
        // positive charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge > 0) {
            pick_flag = true;
        }
    } else if (POI == -9998) {
        // negative charged particles
        int charge = decayer_ptr->get_particle_charge(monval);
        if (charge < 0) {
            pick_flag = true;
        }
    } else if (POI == 9997) {
        // baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon > 0) {
            pick_flag = true;
        }
    } else if (POI == -9997) {
        // anti-baryons
        int baryon = decayer_ptr->get_particle_baryon_number(monval);
        if (baryon < 0) {
            pick_flag = true;
        }
    } else if (POI == 9996) {
        // strangeness
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange > 0) {
            pick_flag = true;
        }
    } else if (POI == -9996) {
        // anti-strangeness
        int strange = decayer_ptr->get_particle_strange_number(monval);
        if (strange < 0) {
            pick_flag = true;
        }
    } else {
        if (monval == POI) {
            pick_flag = true;
        }
    }
    return (pick_flag);
}